

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O1

void JumpMission(int linenumber)

{
  FILE *__stream;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  char acStack_438 [1032];
  
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  __stream = missionfile;
  if (bMissionRunning == 0) {
    pcVar2 = "Cannot use jump outside a mission file.";
  }
  else {
    if (0 < linenumber) {
      lVar1 = ftell((FILE *)missionfile);
      rewind((FILE *)__stream);
      if (linenumber != 1) {
        iVar4 = 0;
        do {
          pcVar2 = fgets(acStack_438,0x400,(FILE *)__stream);
          if (pcVar2 == (char *)0x0) {
            clearerr((FILE *)__stream);
            fseek((FILE *)__stream,(long)(int)lVar1,0);
            pcVar2 = "jump failed.";
            goto LAB_0013a31d;
          }
          sVar3 = strlen(pcVar2);
        } while (((sVar3 == 0x3ff) && (pcVar2[0x3fe] != '\n')) ||
                (bVar5 = iVar4 != linenumber + -2, iVar4 = iVar4 + 1, bVar5));
      }
      goto LAB_0013a322;
    }
    pcVar2 = "Invalid parameter.";
  }
LAB_0013a31d:
  puts(pcVar2);
LAB_0013a322:
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void JumpMission(int linenumber)
{
	EnterCriticalSection(&MissionFilesCS);
	if (bMissionRunning)
	{
		if (linenumber > 0)
		{
			if (fsetline(missionfile, linenumber) != EXIT_SUCCESS)
			{
				printf("jump failed.\n");
			}
		}
		else
		{
			printf("Invalid parameter.\n");
		}
	}
	else
	{
		printf("Cannot use jump outside a mission file.\n");
	}
	LeaveCriticalSection(&MissionFilesCS);
}